

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::ShaderSubroutine::NegativeTest7::test
          (NegativeTest7 *this,GLchar *vertex_shader_code,GLchar *name_of_recursive_routine)

{
  ostringstream *this_00;
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  allocator<char> local_241;
  allocator<char> local_240;
  allocator<char> local_23f;
  allocator<char> local_23e;
  allocator<char> local_23d;
  uint local_23c;
  program program;
  string local_210;
  string local_1f0;
  string local_1d0;
  undefined1 local_1b0 [384];
  
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1b0,vertex_shader_code,&local_23d);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&program,glcts::fixed_sample_locations_values + 1,&local_23e);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1d0,glcts::fixed_sample_locations_values + 1,&local_23f);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f0,glcts::fixed_sample_locations_values + 1,&local_240);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_210,glcts::fixed_sample_locations_values + 1,&local_241);
  local_23c = 1;
  bVar1 = Utils::buildProgram((Functions *)CONCAT44(extraout_var,iVar2),(string *)local_1b0,
                              (string *)&program,&local_1d0,&local_1f0,&local_210,
                              &test::varying_name,&local_23c,&this->m_vertex_shader_id,(GLuint *)0x0
                              ,(GLuint *)0x0,(GLuint *)0x0,(GLuint *)0x0,&this->m_program_id);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)&program);
  std::__cxx11::string::~string((string *)local_1b0);
  if (bVar1) {
    program.m_context = (this->super_TestCase).m_context;
    program.m_tesselation_control_shader_id = 0;
    program.m_tesselation_evaluation_shader_id = 0;
    program.m_vertex_shader_id = 0;
    program.m_compute_shader_id = 0;
    program.m_fragment_shader_id = 0;
    program.m_geometry_shader_id = 0;
    program.m_program_object_id = 0;
    Utils::program::build
              (&program,(GLchar *)0x0,(GLchar *)0x0,(GLchar *)0x0,(GLchar *)0x0,(GLchar *)0x0,
               vertex_shader_code,(GLchar **)0x0,0,false);
    Utils::program::getSubroutineIndex(&program,name_of_recursive_routine,0x8b31);
    local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    this_00 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::operator<<((ostream *)this_00,"Error. Program with potentially recursive subroutine, ");
    std::operator<<((ostream *)this_00,name_of_recursive_routine);
    std::operator<<((ostream *)this_00,", which is active, index: ");
    std::ostream::_M_insert<unsigned_long>((ulong)this_00);
    std::operator<<((ostream *)this_00,", has been built successfully.\n");
    std::operator<<((ostream *)this_00,vertex_shader_code);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    Utils::program::~program(&program);
  }
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[3])(this);
  return !bVar1;
}

Assistant:

bool NegativeTest7::test(const GLchar* vertex_shader_code, const GLchar* name_of_recursive_routine)
{
	const glw::Functions& gl		   = m_context.getRenderContext().getFunctions();
	bool				  result	   = true;
	static const GLchar*  varying_name = "out_result";

	/* Try to build program */
	if (true == Utils::buildProgram(gl, vertex_shader_code, "", "", "", "", &varying_name /* varying_names */,
									1 /* n_varyings */, &m_vertex_shader_id, 0, 0, 0, 0, &m_program_id))
	{
		/* Success is considered an error */

		Utils::program program(m_context);
		GLuint		   index = 0;

		program.build(0, 0, 0, 0, 0, vertex_shader_code, 0, 0);

		/* Verify that recursive subroutine is active */
		try
		{
			index = program.getSubroutineIndex(name_of_recursive_routine, GL_VERTEX_SHADER);
		}
		catch (const std::exception& exc)
		{
			/* Something wrong with shader or compilation */
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message << "It is expected that subroutine: \n"
				<< name_of_recursive_routine
				<< " is considered active. This subroutine is potentially recursive and should cause link failure."
				<< tcu::TestLog::EndMessage;

			throw exc;
		}

		/* Subsoutine is active, however linking should fail */
		m_context.getTestContext().getLog()
			<< tcu::TestLog::Message << "Error. Program with potentially recursive subroutine, "
			<< name_of_recursive_routine << ", which is active, index: " << index << ", has been built successfully.\n"
			<< vertex_shader_code << tcu::TestLog::EndMessage;

		result = false;
	}

	/* Delete program and shader */
	deinit();

	/* Done */
	return result;
}